

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalGenerator *this,cmSourceFile *source)

{
  bool bVar1;
  ulong uVar2;
  pointer ppVar3;
  size_type sVar4;
  allocator<char> local_79;
  key_type *local_78;
  string *ext;
  _Self local_68 [3];
  _Self local_50;
  const_iterator it;
  string *lang;
  cmSourceFile *source_local;
  cmGlobalGenerator *this_local;
  
  cmSourceFile::GetLanguage_abi_cxx11_((string *)&it,source);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&this->LanguageToOutputExtension,(key_type *)&it);
    local_68[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->LanguageToOutputExtension);
    bVar1 = std::operator!=(&local_50,local_68);
    if (bVar1) {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_50);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar3->second);
      goto LAB_004547fa;
    }
  }
  else {
    local_78 = cmSourceFile::GetExtension_abi_cxx11_(source);
    uVar2 = std::__cxx11::string::empty();
    if (((uVar2 & 1) == 0) &&
       (sVar4 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::count(&this->OutputExtensions,local_78), sVar4 != 0)) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_78);
      goto LAB_004547fa;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_79);
  std::allocator<char>::~allocator(&local_79);
LAB_004547fa:
  ext._4_4_ = 1;
  std::__cxx11::string::~string((string *)&it);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::GetLanguageOutputExtension(
  cmSourceFile const& source) const
{
  const std::string& lang = source.GetLanguage();
  if (!lang.empty()) {
    auto const it = this->LanguageToOutputExtension.find(lang);
    if (it != this->LanguageToOutputExtension.end()) {
      return it->second;
    }
  } else {
    // if no language is found then check to see if it is already an
    // output extension for some language.  In that case it should be ignored
    // and in this map, so it will not be compiled but will just be used.
    std::string const& ext = source.GetExtension();
    if (!ext.empty()) {
      if (this->OutputExtensions.count(ext)) {
        return ext;
      }
    }
  }
  return "";
}